

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (a.begin != 0) {
    uVar1 = AllocInst(this,2);
    if (-1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar2,n * 2,a.begin)
      ;
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar2 + 1,n * 2 + 1,
                 0);
      PatchList::Patch((this->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,a.end.p,
                       uVar1 + 1);
      uVar3 = uVar2 + 1 << 0x21;
      goto LAB_001ad154;
    }
  }
  uVar3 = 0;
  uVar2 = 0;
LAB_001ad154:
  return (Frag)(uVar3 | uVar2);
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_.data(), a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1));
}